

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.h
# Opt level: O2

bool __thiscall
FIX::TimeRange::isInSameRange(TimeRange *this,UtcTimeStamp *time1,UtcTimeStamp *time2)

{
  bool bVar1;
  DateTime *time2_00;
  DateTime *time1_00;
  LocalTimeStamp localTime2;
  LocalTimeStamp localTime1;
  DateTime local_88;
  DateTime local_70;
  DateTime local_58;
  DateTime local_40;
  
  time2_00 = &local_88;
  if (this[0x38] == (TimeRange)0x1) {
    LocalTimeStamp::LocalTimeStamp
              ((LocalTimeStamp *)&local_70,
               (long)(time1->super_DateTime).m_date * 0x15180 + -0x3118a41200 +
               (time1->super_DateTime).m_time / 1000000000,0);
    LocalTimeStamp::LocalTimeStamp
              ((LocalTimeStamp *)&local_88,
               (long)(time2->super_DateTime).m_date * 0x15180 + -0x3118a41200 +
               (time2->super_DateTime).m_time / 1000000000,0);
    time1_00 = &local_40;
    local_40._vptr_DateTime = (_func_int **)&PTR__DateTime_002f8a28;
    local_40.m_date = local_70.m_date;
    local_40._12_4_ = local_70._12_4_;
    local_40.m_time = local_70.m_time;
    time2_00 = &local_58;
    local_58._vptr_DateTime = (_func_int **)&PTR__DateTime_002f8a28;
    local_58.m_date = local_88.m_date;
    local_58._12_4_ = local_88._12_4_;
    local_58.m_time = local_88.m_time;
  }
  else {
    time1_00 = &local_70;
    local_70._vptr_DateTime = (_func_int **)&PTR__DateTime_002f8a28;
    local_70.m_date = (time1->super_DateTime).m_date;
    local_70._12_4_ = *(undefined4 *)&(time1->super_DateTime).field_0xc;
    local_70.m_time = (time1->super_DateTime).m_time;
    local_88._vptr_DateTime = (_func_int **)&PTR__DateTime_002f8a28;
    local_88.m_date = (time2->super_DateTime).m_date;
    local_88._12_4_ = *(undefined4 *)&(time2->super_DateTime).field_0xc;
    local_88.m_time = (time2->super_DateTime).m_time;
  }
  bVar1 = isInSameRange(this,time1_00,time2_00);
  return bVar1;
}

Assistant:

bool isInSameRange(const UtcTimeStamp &time1, const UtcTimeStamp &time2) {
    if (m_useLocalTime) {
      LocalTimeStamp localTime1(time1.getTimeT());
      LocalTimeStamp localTime2(time2.getTimeT());
      return isInSameRange((DateTime)localTime1, (DateTime)localTime2);
    }

    return isInSameRange((DateTime)time1, (DateTime)time2);
  }